

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::GeomMesh>
               (GeomMesh *mesh,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *prop_names,bool attr_prop,bool rel_prop)

{
  bool bVar1;
  bool bVar2;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (prop_names ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = GetGPrimPropertyNamesImpl(&mesh->super_GPrim,prop_names,attr_prop,rel_prop);
    if (attr_prop && bVar1) {
      bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
              ::authored(&mesh->points);
      if (bVar1) {
        ::std::__cxx11::string::string((string *)&local_40,"points",&local_41);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                   &local_40);
        ::std::__cxx11::string::_M_dispose();
      }
      bVar2 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
              ::authored(&mesh->normals);
      bVar1 = true;
      if (bVar2) {
        ::std::__cxx11::string::string((string *)&local_40,"normals",&local_41);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)prop_names,
                   &local_40);
        ::std::__cxx11::string::_M_dispose();
      }
    }
  }
  return bVar1;
}

Assistant:

bool GetPrimPropertyNamesImpl(const GeomMesh &mesh,
                              std::vector<std::string> *prop_names,
                              bool attr_prop, bool rel_prop) {
  if (!prop_names) {
    return false;
  }

  if (!GetGPrimPropertyNamesImpl(&mesh, prop_names, attr_prop, rel_prop)) {
    return false;
  }

  if (attr_prop) {
    if (mesh.points.authored()) {
      prop_names->push_back("points");
    }

    if (mesh.normals.authored()) {
      prop_names->push_back("normals");
    }

    DCOUT("TODO: more attrs...");
  }

  return true;
}